

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupSifting(DdManager *table,int lower,int upper,DD_CHKFP checkFunction,int lazyFlag)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *__base;
  bool bVar5;
  bool bVar6;
  int local_74;
  int xindex;
  int dissolve;
  int merged;
  int *sifted;
  int local_50;
  int result;
  int classes;
  int nvars;
  int xInit;
  int x;
  int j;
  int i;
  int *var;
  int lazyFlag_local;
  DD_CHKFP checkFunction_local;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  iVar1 = table->size;
  entry = (int *)0x0;
  _dissolve = (void *)0x0;
  __base = malloc((long)iVar1 << 2);
  if (__base == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    entry = (int *)malloc((long)iVar1 << 2);
    if (entry == (int *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      _dissolve = malloc((long)iVar1 << 2);
      if (_dissolve != (void *)0x0) {
        local_50 = 0;
        for (x = 0; x < iVar1; x = x + 1) {
          *(undefined4 *)((long)_dissolve + (long)x * 4) = 0;
          uVar2 = table->perm[x];
          if (table->subtables[(int)uVar2].next <= uVar2) {
            entry[x] = table->subtables[(int)uVar2].keys;
            *(int *)((long)__base + (long)local_50 * 4) = x;
            local_50 = local_50 + 1;
          }
        }
        qsort(__base,(long)local_50,4,ddUniqueCompareGroup);
        if (lazyFlag != 0) {
          for (x = 0; x < iVar1; x = x + 1) {
            ddResetVarHandled(table,x);
          }
        }
        x = 0;
        do {
          if (local_50 < table->siftMaxVar) {
            local_74 = local_50;
          }
          else {
            local_74 = table->siftMaxVar;
          }
          if ((local_74 <= x) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
            if (_dissolve != (void *)0x0) {
              free(_dissolve);
            }
            if (__base != (void *)0x0) {
              free(__base);
            }
            if (entry != (int *)0x0) {
              free(entry);
              entry = (int *)0x0;
            }
            return 1;
          }
          iVar1 = *(int *)((long)__base + (long)x * 4);
          if ((((*(int *)((long)_dissolve + (long)iVar1 * 4) != 1) &&
               (nvars = table->perm[iVar1], lower <= nvars)) && (nvars <= upper)) &&
             (table->subtables[nvars].bindVar != 1)) {
            bVar5 = nvars != table->subtables[nvars].next;
            if (bVar5) {
              sifted._4_4_ = ddGroupSiftingAux(table,nvars,lower,upper,ddNoCheck,lazyFlag);
            }
            else {
              sifted._4_4_ = ddGroupSiftingAux(table,nvars,lower,upper,checkFunction,lazyFlag);
            }
            if (sifted._4_4_ == 0) goto LAB_00c16a7f;
            bVar6 = false;
            if (((lazyFlag == 0) && (table->groupcheck == CUDD_GROUP_CHECK7)) &&
               (nvars = table->perm[iVar1], nvars == table->subtables[nvars].next)) {
              if (((nvars != upper) &&
                  (*(int *)((long)_dissolve + (long)table->invperm[(int)(nvars + 1)] * 4) == 0)) &&
                 (nvars + 1U == table->subtables[(int)(nvars + 1)].next)) {
                iVar4 = ddSecDiffCheck(table,nvars,nvars + 1);
                bVar6 = iVar4 != 0;
                if (bVar6) {
                  ddCreateGroup(table,nvars,nvars + 1);
                }
              }
              if ((((nvars != lower) &&
                   (*(int *)((long)_dissolve + (long)table->invperm[(int)(nvars - 1)] * 4) == 0)) &&
                  (nvars - 1U == table->subtables[(int)(nvars - 1)].next)) &&
                 (iVar4 = ddSecDiffCheck(table,nvars - 1,nvars), iVar4 != 0)) {
                bVar6 = true;
                ddCreateGroup(table,nvars - 1,nvars);
              }
            }
            if (bVar6) {
              for (; (uint)nvars < table->subtables[nvars].next;
                  nvars = table->subtables[nvars].next) {
              }
              iVar4 = ddGroupSiftingAux(table,nvars,lower,upper,ddNoCheck,lazyFlag);
              if (iVar4 == 0) goto LAB_00c16a7f;
            }
            uVar2 = table->perm[iVar1];
            nvars = uVar2;
            if (uVar2 != table->subtables[(int)uVar2].next) {
              do {
                *(undefined4 *)((long)_dissolve + (long)table->invperm[nvars] * 4) = 1;
                nvars = table->subtables[nvars].next;
              } while (nvars != uVar2);
              if ((lazyFlag == 0) && (!bVar5)) {
                do {
                  uVar3 = table->subtables[nvars].next;
                  table->subtables[nvars].next = nvars;
                  nvars = uVar3;
                } while (uVar3 != uVar2);
              }
            }
            if (lazyFlag != 0) {
              ddSetVarHandled(table,iVar1);
            }
          }
          x = x + 1;
        } while( true );
      }
      table->errorCode = CUDD_MEMORY_OUT;
    }
  }
LAB_00c16a7f:
  if ((entry != (int *)0x0) && (entry != (int *)0x0)) {
    free(entry);
    entry = (int *)0x0;
  }
  if ((__base != (void *)0x0) && (__base != (void *)0x0)) {
    free(__base);
  }
  if ((_dissolve != (void *)0x0) && (_dissolve != (void *)0x0)) {
    free(_dissolve);
  }
  return 0;
}

Assistant:

static int
ddGroupSifting(
  DdManager * table,
  int  lower,
  int  upper,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    int         *var;
    int         i,j,x,xInit;
    int         nvars;
    int         classes;
    int         result;
    int         *sifted;
    int         merged;
    int         dissolve;
#ifdef DD_STATS
    unsigned    previousSize;
#endif
    int         xindex;

    nvars = table->size;

    /* Order variables to sift. */
    entry = NULL;
    sifted = NULL;
    var = ABC_ALLOC(int,nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    entry = ABC_ALLOC(int,nvars);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    sifted = ABC_ALLOC(int,nvars);
    if (sifted == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }

    /* Here we consider only one representative for each group. */
    for (i = 0, classes = 0; i < nvars; i++) {
        sifted[i] = 0;
        x = table->perm[i];
        if ((unsigned) x >= table->subtables[x].next) {
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
            classes++;
        }
    }

    qsort((void *)var,(size_t)classes,sizeof(int),
          (DD_QSFP) ddUniqueCompareGroup);

    if (lazyFlag) {
        for (i = 0; i < nvars; i ++) {
            ddResetVarHandled(table, i);
        }
    }

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        xindex = var[i];
        if (sifted[xindex] == 1) /* variable already sifted as part of group */
            continue;
        x = table->perm[xindex]; /* find current level of this variable */

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        if ((unsigned) x == table->subtables[x].next) {
            dissolve = 1;
            result = ddGroupSiftingAux(table,x,lower,upper,checkFunction,
                                        lazyFlag);
        } else {
            dissolve = 0;
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
        }
        if (!result) goto ddGroupSiftingOutOfMem;

        /* check for aggregation */
        merged = 0;
        if (lazyFlag == 0 && table->groupcheck == CUDD_GROUP_CHECK7) {
            x = table->perm[xindex]; /* find current level */
            if ((unsigned) x == table->subtables[x].next) { /* not part of a group */
                if (x != upper && sifted[table->invperm[x+1]] == 0 &&
                (unsigned) x+1 == table->subtables[x+1].next) {
                    if (ddSecDiffCheck(table,x,x+1)) {
                        merged =1;
                        ddCreateGroup(table,x,x+1);
                    }
                }
                if (x != lower && sifted[table->invperm[x-1]] == 0 &&
                (unsigned) x-1 == table->subtables[x-1].next) {
                    if (ddSecDiffCheck(table,x-1,x)) {
                        merged =1;
                        ddCreateGroup(table,x-1,x);
                    }
                }
            }
        }

        if (merged) { /* a group was created */
            /* move x to bottom of group */
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            /* sift */
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
            if (!result) goto ddGroupSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"_");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"^");
            } else {
                (void) fprintf(table->out,"*");
            }
            fflush(table->out);
        } else {
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }

        /* Mark variables in the group just sifted. */
        x = table->perm[xindex];
        if ((unsigned) x != table->subtables[x].next) {
            xInit = x;
            do {
                j = table->invperm[x];
                sifted[j] = 1;
                x = table->subtables[x].next;
            } while (x != xInit);

            /* Dissolve the group if it was created. */
            if (lazyFlag == 0 && dissolve) {
                do {
                    j = table->subtables[x].next;
                    table->subtables[x].next = x;
                    x = j;
                } while (x != xInit);
            }
        }

#ifdef DD_DEBUG
        if (pr > 0) (void) fprintf(table->out,"ddGroupSifting:");
#endif

      if (lazyFlag) ddSetVarHandled(table, xindex);
    } /* for */

    ABC_FREE(sifted);
    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

ddGroupSiftingOutOfMem:
    if (entry != NULL)  ABC_FREE(entry);
    if (var != NULL)    ABC_FREE(var);
    if (sifted != NULL) ABC_FREE(sifted);

    return(0);

}